

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Vertices(AMFImporter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CAMFImporter_NodeElement *this_00;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  byte local_25;
  bool close_found;
  CAMFImporter_NodeElement *local_18;
  CAMFImporter_NodeElement *ne;
  AMFImporter *this_local;
  
  ne = (CAMFImporter_NodeElement *)this;
  this_00 = (CAMFImporter_NodeElement *)operator_new(0x50);
  CAMFImporter_NodeElement_Vertices::CAMFImporter_NodeElement_Vertices
            ((CAMFImporter_NodeElement_Vertices *)this_00,this->mNodeElement_Cur);
  local_18 = this_00;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    ParseHelper_Node_Enter(this,local_18);
    local_25 = 0;
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) goto LAB_005e492f;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"vertex",&local_49)
          ;
          bVar1 = XML_CheckNode_NameEqual(this,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::allocator<char>::~allocator(&local_49);
          if (bVar1) {
            ParseNode_Vertex(this);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"vertices",&local_71);
            XML_CheckNode_SkipUnsupported(this,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::allocator<char>::~allocator(&local_71);
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"vertices",&local_99);
      bVar1 = XML_CheckNode_NameEqual(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    } while (!bVar1);
    local_25 = 1;
LAB_005e492f:
    if ((local_25 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"vertices",&local_c1);
      Throw_CloseNotFound(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&local_18);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&local_18);
  return;
}

Assistant:

void AMFImporter::ParseNode_Vertices()
{
CAMFImporter_NodeElement* ne;

	// create new mesh object.
	ne = new CAMFImporter_NodeElement_Vertices(mNodeElement_Cur);
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("vertices");
			if(XML_CheckNode_NameEqual("vertex")) { ParseNode_Vertex(); continue; }
		MACRO_NODECHECK_LOOPEND("vertices");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}